

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void r4k_helper_tlbp_mips64el(CPUMIPSState_conflict5 *env)

{
  ulong *puVar1;
  ulong uVar2;
  bool bVar3;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  int i;
  uint32_t tlb_mmid;
  uint32_t MMID;
  uint16_t ASID;
  target_ulong VPN;
  target_ulong tag;
  target_ulong mask;
  r4k_tlb_t_conflict *tlb;
  _Bool mi;
  CPUMIPSState_conflict5 *env_local;
  
  bVar3 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  local_4c = env->CP0_MemoryMapID;
  if (bVar3) {
    local_4c = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  for (local_48 = 0; local_48 < env->tlb->nb_tlb; local_48 = local_48 + 1) {
    puVar1 = (ulong *)((long)&env->tlb->mmu + (long)(int)local_48 * 0x28);
    uVar2 = (ulong)(uint)puVar1[1] | 0x1fff;
    if (bVar3) {
      local_50 = (uint)*(ushort *)((long)puVar1 + 0xc);
    }
    else {
      local_50 = (uint)puVar1[2];
    }
    if (((((*(ushort *)((long)puVar1 + 0x14) & 1) == 1) || (local_50 == local_4c)) &&
        ((*puVar1 & (uVar2 ^ 0xffffffffffffffff)) ==
         (env->SEGMask & env->CP0_EntryHi & (uVar2 ^ 0xffffffffffffffff)))) &&
       (-1 < *(short *)((long)puVar1 + 0x14))) {
      env->CP0_Index = local_48;
      break;
    }
  }
  if (local_48 == env->tlb->nb_tlb) {
    for (local_48 = env->tlb->nb_tlb; local_48 < env->tlb->tlb_in_use; local_48 = local_48 + 1) {
      puVar1 = (ulong *)((long)&env->tlb->mmu + (long)(int)local_48 * 0x28);
      uVar2 = (ulong)(uint)puVar1[1] | 0x1fff;
      if (bVar3) {
        local_54 = (uint)*(ushort *)((long)puVar1 + 0xc);
      }
      else {
        local_54 = (uint)puVar1[2];
      }
      if ((((*(ushort *)((long)puVar1 + 0x14) & 1) == 1) || (local_54 == local_4c)) &&
         ((*puVar1 & (uVar2 ^ 0xffffffffffffffff)) ==
          (env->SEGMask & env->CP0_EntryHi & (uVar2 ^ 0xffffffffffffffff)))) {
        r4k_mips_tlb_flush_extra(env,local_48);
        break;
      }
    }
    env->CP0_Index = env->CP0_Index | 0x80000000;
  }
  return;
}

Assistant:

void r4k_helper_tlbp(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    r4k_tlb_t *tlb;
    target_ulong mask;
    target_ulong tag;
    target_ulong VPN;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;
    for (i = 0; i < env->tlb->nb_tlb; i++) {
        tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        tag = env->CP0_EntryHi & ~mask;
        VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        /* Check ASID/MMID, virtual page number & size */
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            env->CP0_Index = i;
            break;
        }
    }
    if (i == env->tlb->nb_tlb) {
        /* No match.  Discard any shadow entries, if any of them match.  */
        for (i = env->tlb->nb_tlb; i < env->tlb->tlb_in_use; i++) {
            tlb = &env->tlb->mmu.r4k.tlb[i];
            /* 1k pages are not supported. */
            mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
            tag = env->CP0_EntryHi & ~mask;
            VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
            tag &= env->SEGMask;
#endif
            tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
            /* Check ASID/MMID, virtual page number & size */
            if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag) {
                r4k_mips_tlb_flush_extra(env, i);
                break;
            }
        }

        env->CP0_Index |= 0x80000000;
    }
}